

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

void __thiscall QFileDialog::setAcceptMode(QFileDialog *this,AcceptMode mode)

{
  QFileDialogPrivate *this_00;
  Ui_QFileDialog *pUVar1;
  QWidget *this_01;
  StandardButton which;
  
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  QFileDialogOptions::setAcceptMode((AcceptMode)(this_00->options).value.ptr);
  QWidget::setAttribute((QWidget *)this,WA_DontShowOnScreen,false);
  pUVar1 = (this_00->qFileDialogUi).d;
  if (pUVar1 == (Ui_QFileDialog *)0x0 || (this_00->super_QDialogPrivate).nativeDialogInUse != false)
  {
    return;
  }
  which = Save;
  if (mode == AcceptOpen) {
    which = Open;
  }
  QDialogButtonBox::setStandardButtons
            ((QDialogButtonBox *)pUVar1->buttonBox,(StandardButtons)(which + Cancel));
  this_01 = (QWidget *)
            QDialogButtonBox::button
                      ((QDialogButtonBox *)((this_00->qFileDialogUi).d)->buttonBox,which);
  QWidget::setEnabled(this_01,false);
  QFileDialogPrivate::updateOkButton(this_00);
  if (mode == AcceptSave) {
    QComboBox::setEditable(&((this_00->qFileDialogUi).d)->lookInCombo->super_QComboBox,false);
  }
  QFileDialogPrivate::retranslateWindowTitle(this_00);
  return;
}

Assistant:

void QFileDialog::setAcceptMode(QFileDialog::AcceptMode mode)
{
    Q_D(QFileDialog);
    d->options->setAcceptMode(static_cast<QFileDialogOptions::AcceptMode>(mode));
    // clear WA_DontShowOnScreen so that d->canBeNativeDialog() doesn't return false incorrectly
    setAttribute(Qt::WA_DontShowOnScreen, false);
    if (!d->usingWidgets())
        return;
    QDialogButtonBox::StandardButton button = (mode == AcceptOpen ? QDialogButtonBox::Open : QDialogButtonBox::Save);
    d->qFileDialogUi->buttonBox->setStandardButtons(button | QDialogButtonBox::Cancel);
    d->qFileDialogUi->buttonBox->button(button)->setEnabled(false);
    d->updateOkButton();
    if (mode == AcceptSave) {
        d->qFileDialogUi->lookInCombo->setEditable(false);
    }
    d->retranslateWindowTitle();
}